

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::python::Generator::PrintFileDescriptor(Generator *this)

{
  Printer *this_00;
  undefined4 uVar1;
  bool bVar2;
  Syntax SVar3;
  int iVar4;
  mapped_type *pmVar5;
  string *psVar6;
  FileOptions *this_01;
  FileDescriptor *pFVar7;
  Syntax syntax;
  undefined1 local_2e8 [8];
  string module_alias_1;
  undefined1 local_2c0 [4];
  int i_1;
  string module_alias;
  undefined1 local_298 [4];
  int i;
  char local_278 [8];
  char file_descriptor_template [189];
  string local_198;
  allocator local_171;
  key_type local_170;
  string local_150;
  string local_130;
  allocator local_109;
  key_type local_108;
  string local_e8;
  allocator local_c1;
  key_type local_c0;
  allocator local_99;
  key_type local_98;
  allocator local_61;
  key_type local_60;
  undefined1 local_40 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  Generator *this_local;
  
  m._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"descriptor_name",&local_61);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_40,&local_60);
  std::__cxx11::string::operator=((string *)pmVar5,"DESCRIPTOR");
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  psVar6 = FileDescriptor::name_abi_cxx11_(this->file_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"name",&local_99);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_40,&local_98);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)psVar6);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  psVar6 = FileDescriptor::package_abi_cxx11_(this->file_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"package",&local_c1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_40,&local_c0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)psVar6);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  SVar3 = FileDescriptor::syntax(this->file_);
  (anonymous_namespace)::StringifySyntax_abi_cxx11_
            (&local_e8,(_anonymous_namespace_ *)(ulong)SVar3,syntax);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"syntax",&local_109);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_40,&local_108);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string((string *)&local_e8);
  this_01 = FileDescriptor::options(this->file_);
  MessageLite::SerializeAsString_abi_cxx11_(&local_150,(MessageLite *)this_01);
  OptionsValue(&local_130,this,&local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"options",&local_171);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_40,&local_170);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  strings::CHexEscape(&local_198,&this->file_descriptor_serialized_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(file_descriptor_template + 0xb8),"serialized_descriptor",
             (allocator *)(file_descriptor_template + 0xb7));
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_40,(key_type *)(file_descriptor_template + 0xb8));
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_198);
  std::__cxx11::string::~string((string *)(file_descriptor_template + 0xb8));
  std::allocator<char>::~allocator((allocator<char> *)(file_descriptor_template + 0xb7));
  std::__cxx11::string::~string((string *)&local_198);
  bVar2 = GeneratingDescriptorProto(this);
  if (bVar2) {
    io::Printer::Print<>(this->printer_,"if _descriptor._USE_C_DESCRIPTORS == False:\n");
    io::Printer::Indent(this->printer_);
    memcpy(local_278,
           "$descriptor_name$ = _descriptor.FileDescriptor(\n  name=\'$name$\',\n  package=\'$package$\',\n  syntax=\'$syntax$\',\n  serialized_options=$options$,\n  create_key=_descriptor._internal_create_key,\n"
           ,0xbd);
    io::Printer::Print(this->printer_,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_40,local_278);
    io::Printer::Indent(this->printer_);
    if ((this->pure_python_workable_ & 1U) == 0) {
      io::Printer::Print<>(this->printer_,"serialized_pb=\'\'\n");
    }
    else {
      this_00 = this->printer_;
      strings::CHexEscape((string *)local_298,&this->file_descriptor_serialized_);
      io::Printer::Print<char[6],std::__cxx11::string>
                (this_00,"serialized_pb=b\'$value$\'\n",(char (*) [6])0x7c8c1c,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298);
      std::__cxx11::string::~string((string *)local_298);
      iVar4 = FileDescriptor::dependency_count(this->file_);
      if (iVar4 != 0) {
        io::Printer::Print<>(this->printer_,",\ndependencies=[");
        for (module_alias.field_2._12_4_ = 0; uVar1 = module_alias.field_2._12_4_,
            iVar4 = FileDescriptor::dependency_count(this->file_), (int)uVar1 < iVar4;
            module_alias.field_2._12_4_ = module_alias.field_2._12_4_ + 1) {
          pFVar7 = FileDescriptor::dependency(this->file_,module_alias.field_2._12_4_);
          psVar6 = FileDescriptor::name_abi_cxx11_(pFVar7);
          anon_unknown_0::ModuleAlias((string *)local_2c0,psVar6);
          io::Printer::Print<char[13],std::__cxx11::string>
                    (this->printer_,"$module_alias$.DESCRIPTOR,",(char (*) [13])"module_alias",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0)
          ;
          std::__cxx11::string::~string((string *)local_2c0);
        }
        io::Printer::Print<>(this->printer_,"]");
      }
      iVar4 = FileDescriptor::public_dependency_count(this->file_);
      if (0 < iVar4) {
        io::Printer::Print<>(this->printer_,",\npublic_dependencies=[");
        for (module_alias_1.field_2._12_4_ = 0; uVar1 = module_alias_1.field_2._12_4_,
            iVar4 = FileDescriptor::public_dependency_count(this->file_), (int)uVar1 < iVar4;
            module_alias_1.field_2._12_4_ = module_alias_1.field_2._12_4_ + 1) {
          pFVar7 = FileDescriptor::public_dependency(this->file_,module_alias_1.field_2._12_4_);
          psVar6 = FileDescriptor::name_abi_cxx11_(pFVar7);
          anon_unknown_0::ModuleAlias((string *)local_2e8,psVar6);
          io::Printer::Print<char[13],std::__cxx11::string>
                    (this->printer_,"$module_alias$.DESCRIPTOR,",(char (*) [13])"module_alias",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8)
          ;
          std::__cxx11::string::~string((string *)local_2e8);
        }
        io::Printer::Print<>(this->printer_,"]");
      }
    }
    io::Printer::Outdent(this->printer_);
    io::Printer::Print<>(this->printer_,")\n");
    io::Printer::Outdent(this->printer_);
    io::Printer::Print<>(this->printer_,"else:\n");
    io::Printer::Indent(this->printer_);
  }
  io::Printer::Print(this->printer_,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_40,
                     "$descriptor_name$ = _descriptor_pool.Default().AddSerializedFile(b\'$serialized_descriptor$\')\n"
                    );
  bVar2 = GeneratingDescriptorProto(this);
  if (bVar2) {
    io::Printer::Outdent(this->printer_);
  }
  io::Printer::Print<>(this->printer_,"\n");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_40);
  return;
}

Assistant:

void Generator::PrintFileDescriptor() const {
  std::map<std::string, std::string> m;
  m["descriptor_name"] = kDescriptorKey;
  m["name"] = file_->name();
  m["package"] = file_->package();
  m["syntax"] = StringifySyntax(file_->syntax());
  m["options"] = OptionsValue(file_->options().SerializeAsString());
  m["serialized_descriptor"] = strings::CHexEscape(file_descriptor_serialized_);
  if (GeneratingDescriptorProto()) {
    printer_->Print("if _descriptor._USE_C_DESCRIPTORS == False:\n");
    printer_->Indent();
    // Pure python's AddSerializedFile() depend on the generated
    // descriptor_pb2.py thus we can not use AddSerializedFile() when
    // generated descriptor.proto for pure python.
    const char file_descriptor_template[] =
        "$descriptor_name$ = _descriptor.FileDescriptor(\n"
        "  name='$name$',\n"
        "  package='$package$',\n"
        "  syntax='$syntax$',\n"
        "  serialized_options=$options$,\n"
        "  create_key=_descriptor._internal_create_key,\n";
    printer_->Print(m, file_descriptor_template);
    printer_->Indent();
    if (pure_python_workable_) {
      printer_->Print("serialized_pb=b'$value$'\n", "value",
                      strings::CHexEscape(file_descriptor_serialized_));
      if (file_->dependency_count() != 0) {
        printer_->Print(",\ndependencies=[");
        for (int i = 0; i < file_->dependency_count(); ++i) {
          std::string module_alias = ModuleAlias(file_->dependency(i)->name());
          printer_->Print("$module_alias$.DESCRIPTOR,", "module_alias",
                          module_alias);
        }
        printer_->Print("]");
      }
      if (file_->public_dependency_count() > 0) {
        printer_->Print(",\npublic_dependencies=[");
        for (int i = 0; i < file_->public_dependency_count(); ++i) {
          std::string module_alias =
              ModuleAlias(file_->public_dependency(i)->name());
          printer_->Print("$module_alias$.DESCRIPTOR,", "module_alias",
                          module_alias);
        }
        printer_->Print("]");
      }
    } else {
      printer_->Print("serialized_pb=''\n");
    }

    // TODO(falk): Also print options and fix the message_type, enum_type,
    //             service and extension later in the generation.

    printer_->Outdent();
    printer_->Print(")\n");

    printer_->Outdent();
    printer_->Print("else:\n");
    printer_->Indent();
  }
  printer_->Print(m,
                  "$descriptor_name$ = "
                  "_descriptor_pool.Default().AddSerializedFile(b'$serialized_"
                  "descriptor$')\n");
  if (GeneratingDescriptorProto()) {
    printer_->Outdent();
  }
  printer_->Print("\n");
}